

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O2

socket_t sock_connect(uint32_t ip,int port)

{
  ushort uVar1;
  int __fd;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  vw_exception *pvVar8;
  long lVar9;
  char dotted_quad [16];
  sockaddr_in far_end;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  char servInfo [32];
  char __errmsg [256];
  stringstream __msg;
  ostream local_538 [3];
  char __errmsg_2 [256];
  
  uVar1 = (ushort)port;
  __fd = socket(2,1,0);
  if (__fd == -1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar4 = local_538;
    std::operator<<(poVar4,"socket");
    piVar5 = __errno_location();
    pcVar3 = __errmsg;
    pcVar7 = strerror_r(*piVar5,pcVar3,0x100);
    if (pcVar7 == (char *)0x0) {
      poVar4 = std::operator<<(poVar4,"errno = ");
    }
    else {
      pcVar3 = "errno = unknown";
    }
    std::operator<<(poVar4,pcVar3);
    pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
               ,0x26,&local_718);
    __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  far_end.sin_family = 2;
  far_end.sin_zero[0] = '\0';
  far_end.sin_zero[1] = '\0';
  far_end.sin_zero[2] = '\0';
  far_end.sin_zero[3] = '\0';
  far_end.sin_zero[4] = '\0';
  far_end.sin_zero[5] = '\0';
  far_end.sin_zero[6] = '\0';
  far_end.sin_zero[7] = '\0';
  far_end.sin_port = uVar1;
  far_end.sin_addr.s_addr = ip;
  pcVar3 = inet_ntop(2,&far_end.sin_addr,dotted_quad,0x10);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar4 = local_538;
    std::operator<<(poVar4,"inet_ntop");
    piVar5 = __errno_location();
    pcVar3 = __errmsg;
    pcVar7 = strerror_r(*piVar5,pcVar3,0x100);
    if (pcVar7 == (char *)0x0) {
      poVar4 = std::operator<<(poVar4,"errno = ");
    }
    else {
      pcVar3 = "errno = unknown";
    }
    std::operator<<(poVar4,pcVar3);
    pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
               ,0x32,&local_738);
    __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  iVar2 = getnameinfo((sockaddr *)&far_end,0x10,(char *)&__msg,0x401,servInfo,0x20,2);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)__errmsg);
    poVar4 = (ostream *)(__errmsg + 0x10);
    poVar6 = std::operator<<(poVar4,"getnameinfo(");
    poVar6 = std::operator<<(poVar6,dotted_quad);
    std::operator<<(poVar6,")");
    piVar5 = __errno_location();
    pcVar3 = __errmsg_2;
    pcVar7 = strerror_r(*piVar5,pcVar3,0x100);
    if (pcVar7 == (char *)0x0) {
      poVar4 = std::operator<<(poVar4,"errno = ");
    }
    else {
      pcVar3 = "errno = unknown";
    }
    std::operator<<(poVar4,pcVar3);
    pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
               ,0x37,&local_758);
    __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"connecting to ");
  poVar4 = std::operator<<(poVar4,dotted_quad);
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::operator<<(poVar4,(char *)&__msg);
  poVar4 = std::operator<<(poVar4,':');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 << 8 | uVar1 >> 8);
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar9 = 1;
  while( true ) {
    iVar2 = connect(__fd,(sockaddr *)&far_end,0x10);
    if ((iVar2 != -1) || (99 < lVar9 - 1U)) break;
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar4 = std::operator<<(local_538,"connect attempt ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," failed: ");
    piVar5 = __errno_location();
    pcVar3 = strerror(*piVar5);
    std::operator<<(poVar4,pcVar3);
    std::__cxx11::stringbuf::str();
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)__errmsg);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)__errmsg);
    sleep(1);
    std::__cxx11::stringstream::~stringstream((stringstream *)&__msg);
    lVar9 = lVar9 + 1;
  }
  if (iVar2 != -1) {
    return __fd;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(local_538,"cannot connect");
  pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
             ,0x4b,&local_778);
  __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

socket_t sock_connect(const uint32_t ip, const int port)
{
  socket_t sock = socket(PF_INET, SOCK_STREAM, 0);
  if (sock == -1)
    THROWERRNO("socket");

  sockaddr_in far_end;
  far_end.sin_family = AF_INET;
  far_end.sin_port = port;

  far_end.sin_addr = *(in_addr*)&ip;
  memset(&far_end.sin_zero, '\0', 8);

  {
    char dotted_quad[INET_ADDRSTRLEN];
    if (nullptr == inet_ntop(AF_INET, &(far_end.sin_addr), dotted_quad, INET_ADDRSTRLEN))
      THROWERRNO("inet_ntop");

    char hostname[NI_MAXHOST];
    char servInfo[NI_MAXSERV];
    if (getnameinfo((sockaddr*)&far_end, sizeof(sockaddr), hostname, NI_MAXHOST, servInfo, NI_MAXSERV, NI_NUMERICSERV))
      THROWERRNO("getnameinfo(" << dotted_quad << ")");

    cerr << "connecting to " << dotted_quad << " = " << hostname << ':' << ntohs(port) << endl;
  }

  size_t count = 0;
  int ret;
  while ((ret = connect(sock, (sockaddr*)&far_end, sizeof(far_end))) == -1 && count < 100)
  {
    count++;
    stringstream msg;
    msg << "connect attempt " << count << " failed: " << strerror(errno);
    cerr << msg.str() << endl;
#ifdef _WIN32
    Sleep(1);
#else
    sleep(1);
#endif
  }
  if (ret == -1)
    THROW("cannot connect");
  return sock;
}